

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileData.h
# Opt level: O2

void __thiscall Assimp::Q3BSP::Q3BSPModel::Q3BSPModel(Q3BSPModel *this)

{
  allocator<char> local_41 [17];
  
  memset(this,0,0xc0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_ModelName,"",local_41);
  return;
}

Assistant:

Q3BSPModel() :
        m_Data(),
        m_Lumps(),
        m_Vertices(),
        m_Faces(),
        m_Indices(),
        m_Textures(),
        m_Lightmaps(),
        m_EntityData(),
        m_ModelName( "" )
    {
        // empty
    }